

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O3

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  char cVar1;
  __int32_t **pp_Var2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  
  if ((token == (char *)0x0) || (pcVar5 = *subj, pcVar5 == (char *)0x0)) {
    nn_ws_match_token_cold_1();
  }
  cVar3 = *token;
  if (case_insensitive == 0) {
    if (cVar3 != '\0') {
      pcVar4 = token + 1;
      do {
        if (cVar3 != *pcVar5) {
          return 0;
        }
        pcVar5 = pcVar5 + 1;
        cVar3 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar3 != '\0');
    }
  }
  else if (cVar3 != '\0') {
    pcVar4 = token + 1;
    do {
      cVar1 = *pcVar5;
      if ((long)cVar1 == 0) {
        return 0;
      }
      pp_Var2 = __ctype_tolower_loc();
      if ((*pp_Var2)[cVar3] != (*pp_Var2)[cVar1]) {
        return 0;
      }
      pcVar5 = pcVar5 + 1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  *subj = pcVar5;
  return 1;
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}